

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

SimpleString HexStringFrom(char value)

{
  size_t extraout_RDX;
  uint in_ESI;
  undefined7 in_register_00000039;
  SimpleString *this;
  SimpleString SVar2;
  SimpleString SStack_28;
  size_t sVar1;
  
  this = (SimpleString *)CONCAT71(in_register_00000039,value);
  SVar2 = StringFromFormat((char *)this,"%x",(ulong)in_ESI);
  sVar1 = SVar2.bufferSize_;
  if ((char)in_ESI < '\0') {
    SimpleString::size(this);
    SimpleString::subString(&SStack_28,(size_t)this);
    SimpleString::operator=(this,&SStack_28);
    SimpleString::~SimpleString(&SStack_28);
    sVar1 = extraout_RDX;
  }
  SVar2.bufferSize_ = sVar1;
  SVar2.buffer_ = (char *)this;
  return SVar2;
}

Assistant:

SimpleString HexStringFrom(signed char value)
{
    SimpleString result = StringFromFormat("%x", value);
    if(value < 0) {
        size_t size = result.size();
        result = result.subString(size-(CPPUTEST_CHAR_BIT/4));
    }
    return result;
}